

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitSIMDTernary
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::PrecomputingExpressionRunner> *this,
          SIMDTernary *curr)

{
  Literal *pLVar1;
  Literal local_160;
  Literal local_148;
  Literal local_130;
  Literal local_118;
  Literal local_100;
  undefined1 local_e8 [8];
  Flow flow;
  Literal c;
  undefined1 local_58 [8];
  Literal a;
  Literal b;
  
  visit((Flow *)local_e8,this,curr->a);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    pLVar1 = Flow::getSingleValue((Flow *)local_e8);
    Literal::Literal((Literal *)local_58,pLVar1);
    visit((Flow *)&flow.breakTo.super_IString.str._M_str,this,curr->b);
    Flow::operator=((Flow *)local_e8,(Flow *)&flow.breakTo.super_IString.str._M_str);
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str);
    if (flow.breakTo.super_IString.str._M_len == 0) {
      pLVar1 = Flow::getSingleValue((Flow *)local_e8);
      Literal::Literal((Literal *)&a.type,pLVar1);
      visit((Flow *)&flow.breakTo.super_IString.str._M_str,this,curr->c);
      Flow::operator=((Flow *)local_e8,(Flow *)&flow.breakTo.super_IString.str._M_str);
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&flow.breakTo.super_IString.str._M_str);
      if (flow.breakTo.super_IString.str._M_len == 0) {
        pLVar1 = Flow::getSingleValue((Flow *)local_e8);
        Literal::Literal((Literal *)&flow.breakTo.super_IString.str._M_str,pLVar1);
        switch(curr->op) {
        case Bitselect:
        case LaneselectI8x16:
        case LaneselectI16x8:
        case LaneselectI32x4:
        case LaneselectI64x2:
          pLVar1 = &local_160;
          Literal::bitselectV128
                    (pLVar1,(Literal *)&flow.breakTo.super_IString.str._M_str,(Literal *)local_58,
                     (Literal *)&a.type);
          Flow::Flow(__return_storage_ptr__,pLVar1);
          break;
        case RelaxedFmaVecF32x4:
          pLVar1 = &local_148;
          Literal::relaxedFmaF32x4
                    (pLVar1,(Literal *)local_58,(Literal *)&a.type,
                     (Literal *)&flow.breakTo.super_IString.str._M_str);
          Flow::Flow(__return_storage_ptr__,pLVar1);
          break;
        case RelaxedFmsVecF32x4:
          pLVar1 = &local_130;
          Literal::relaxedFmsF32x4
                    (pLVar1,(Literal *)local_58,(Literal *)&a.type,
                     (Literal *)&flow.breakTo.super_IString.str._M_str);
          Flow::Flow(__return_storage_ptr__,pLVar1);
          break;
        case RelaxedFmaVecF64x2:
          pLVar1 = &local_118;
          Literal::relaxedFmaF64x2
                    (pLVar1,(Literal *)local_58,(Literal *)&a.type,
                     (Literal *)&flow.breakTo.super_IString.str._M_str);
          Flow::Flow(__return_storage_ptr__,pLVar1);
          break;
        case RelaxedFmsVecF64x2:
          pLVar1 = &local_100;
          Literal::relaxedFmsF64x2
                    (pLVar1,(Literal *)local_58,(Literal *)&a.type,
                     (Literal *)&flow.breakTo.super_IString.str._M_str);
          Flow::Flow(__return_storage_ptr__,pLVar1);
          break;
        default:
          handle_unreachable("not implemented",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                             ,0x46a);
        }
        Literal::~Literal(pLVar1);
        Literal::~Literal((Literal *)&flow.breakTo.super_IString.str._M_str);
      }
      else {
        Flow::Flow(__return_storage_ptr__,(Flow *)local_e8);
      }
      Literal::~Literal((Literal *)&a.type);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_e8);
    }
    Literal::~Literal((Literal *)local_58);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_e8);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_e8);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDTernary(SIMDTernary* curr) {
    NOTE_ENTER("SIMDBitselect");
    Flow flow = self()->visit(curr->a);
    if (flow.breaking()) {
      return flow;
    }
    Literal a = flow.getSingleValue();
    flow = self()->visit(curr->b);
    if (flow.breaking()) {
      return flow;
    }
    Literal b = flow.getSingleValue();
    flow = self()->visit(curr->c);
    if (flow.breaking()) {
      return flow;
    }
    Literal c = flow.getSingleValue();
    switch (curr->op) {
      case Bitselect:
      case LaneselectI8x16:
      case LaneselectI16x8:
      case LaneselectI32x4:
      case LaneselectI64x2:
        return c.bitselectV128(a, b);

      case RelaxedFmaVecF32x4:
        return a.relaxedFmaF32x4(b, c);
      case RelaxedFmsVecF32x4:
        return a.relaxedFmsF32x4(b, c);
      case RelaxedFmaVecF64x2:
        return a.relaxedFmaF64x2(b, c);
      case RelaxedFmsVecF64x2:
        return a.relaxedFmsF64x2(b, c);
      default:
        // TODO: implement signselect and dot_add
        WASM_UNREACHABLE("not implemented");
    }
  }